

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActiveDirectory.cpp
# Opt level: O3

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::ActiveDirectory::status
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,ActiveDirectory *this,Path *path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Client *client;
  long *plVar2;
  ulong *puVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  Path local_88;
  Url local_68;
  string local_48;
  
  client = *(Client **)this;
  Vault::operator+(&local_48,"library/",path);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_48);
  puVar3 = (ulong *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar3) {
    local_98._M_allocated_capacity = *puVar3;
    local_98._8_8_ = plVar2[3];
    local_88.value_._M_dataplus._M_p = (pointer)&local_98;
  }
  else {
    local_98._M_allocated_capacity = *puVar3;
    local_88.value_._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_88.value_._M_string_length = plVar2[1];
  *plVar2 = (long)puVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  paVar1 = &local_88.value_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.value_._M_dataplus._M_p == &local_98) {
    local_88.value_.field_2._8_8_ = local_98._8_8_;
    local_88.value_._M_dataplus._M_p = (pointer)paVar1;
  }
  local_88.value_.field_2._M_allocated_capacity = local_98._M_allocated_capacity;
  local_98._M_allocated_capacity = local_98._M_allocated_capacity & 0xffffffffffffff00;
  getUrl(&local_68,this,&local_88);
  HttpConsumer::get(__return_storage_ptr__,client,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.value_._M_dataplus._M_p != &local_68.value_.field_2) {
    operator_delete(local_68.value_._M_dataplus._M_p,
                    local_68.value_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.value_._M_dataplus._M_p != paVar1) {
    operator_delete(local_88.value_._M_dataplus._M_p,
                    local_88.value_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> Vault::ActiveDirectory::status(const Path &path) {
  return HttpConsumer::get(client_,
                           getUrl(Path{"library/" + path + "/status"}));
}